

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Buffers::ClearTest::LogFail<unsigned_short>
          (ClearTest *this,bool use_sub_data,GLenum internalformat,unsigned_short *data,
          unsigned_short *reference,GLsizei count)

{
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *this_02;
  MessageBuilder local_540;
  string local_3c0 [32];
  stringstream local_3a0 [8];
  stringstream number_1;
  undefined1 local_390 [380];
  int local_214;
  string local_210 [4];
  GLsizei i_1;
  stringstream local_1f0 [8];
  stringstream number;
  undefined1 local_1e0 [376];
  int local_68;
  GLsizei i;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string the_log;
  GLsizei count_local;
  unsigned_short *reference_local;
  unsigned_short *data_local;
  GLenum internalformat_local;
  bool use_sub_data_local;
  ClearTest *this_local;
  
  the_log.field_2._12_4_ = count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"The test of ",&local_51);
  std::allocator<char>::~allocator(&local_51);
  if (use_sub_data) {
    std::__cxx11::string::append(local_50);
  }
  else {
    std::__cxx11::string::append(local_50);
  }
  std::__cxx11::string::append(local_50);
  for (local_68 = 0; local_68 < (int)the_log.field_2._12_4_; local_68 = local_68 + 1) {
    std::__cxx11::stringstream::stringstream(local_1f0);
    std::ostream::operator<<(local_1e0,data[local_68]);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::append((string *)local_50);
    std::__cxx11::string::~string(local_210);
    if (local_68 != the_log.field_2._12_4_ + -1) {
      std::__cxx11::string::append(local_50);
    }
    std::__cxx11::stringstream::~stringstream(local_1f0);
  }
  std::__cxx11::string::append(local_50);
  for (local_214 = 0; local_214 < (int)the_log.field_2._12_4_; local_214 = local_214 + 1) {
    std::__cxx11::stringstream::stringstream(local_3a0);
    std::ostream::operator<<(local_390,reference[local_214]);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::append((string *)local_50);
    std::__cxx11::string::~string(local_3c0);
    if (local_214 != the_log.field_2._12_4_ + -1) {
      std::__cxx11::string::append(local_50);
    }
    std::__cxx11::stringstream::~stringstream(local_3a0);
  }
  std::__cxx11::string::append(local_50);
  this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_540,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  this_02 = tcu::MessageBuilder::operator<<
                      (&local_540,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                      );
  tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_540);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void ClearTest::LogFail(bool use_sub_data, glw::GLenum internalformat, const T* data, const T* reference,
						const glw::GLsizei count)
{
	(void)internalformat;
	std::string the_log = "The test of ";

	if (use_sub_data)
	{
		the_log.append("ClearNamedBufferSubData has failed for internalformat ");
	}
	else
	{
		the_log.append("ClearNamedBufferData has failed for internalformat ");
	}

	//the_log.append(glu::getPixelFormatName(internalformat));
	the_log.append(". Cleared buffer data is equal to [");

	for (glw::GLsizei i = 0; i < count; ++i)
	{
		std::stringstream number;

		number << data[i];

		the_log.append(number.str());

		if (i != count - 1)
		{
			the_log.append(", ");
		}
	}

	the_log.append("], but [");

	for (glw::GLsizei i = 0; i < count; ++i)
	{
		std::stringstream number;

		number << reference[i];

		the_log.append(number.str());

		if (i != count - 1)
		{
			the_log.append(", ");
		}
	}

	the_log.append("] was expected.");

	m_context.getTestContext().getLog() << tcu::TestLog::Message << the_log << tcu::TestLog::EndMessage;
}